

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_test_connection.c
# Opt level: O0

apx_error_t apx_serverTestConnection_create(apx_serverTestConnection_t *self)

{
  adt_ary_t *paVar1;
  int local_94;
  undefined1 local_90 [4];
  apx_error_t result;
  apx_connectionInterface_t connection_interface;
  apx_connectionBaseVTable_t base_connection_vtable;
  apx_serverTestConnection_t *self_local;
  
  if (self == (apx_serverTestConnection_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    self->default_buffer_size = 0x400;
    self->pending_bytes = 0;
    apx_connectionBaseVTable_create
              ((apx_connectionBaseVTable_t *)&connection_interface.remote_file_write_notification,
               apx_serverTestConnection_vdestroy,apx_serverTestConnection_vstart,
               apx_serverTestConnection_vclose);
    create_connection_interface_vtable(self,(apx_connectionInterface_t *)local_90);
    local_94 = apx_serverConnection_create
                         (&self->base,
                          (apx_connectionBaseVTable_t *)
                          &connection_interface.remote_file_write_notification,
                          (apx_connectionInterface_t *)local_90);
    if (local_94 == 0) {
      paVar1 = adt_ary_new(adt_bytearray_vdelete);
      self->transmit_log = paVar1;
      if (self->transmit_log == (adt_ary_t *)0x0) {
        local_94 = 2;
      }
      else {
        adt_bytearray_create(&self->transmit_buffer,0);
      }
    }
    if (local_94 == 0) {
      apx_nodeManager_create(&self->node_manager,'\x02');
      apx_serverConnection_attach_node_manager(&self->base,&self->node_manager);
    }
    self_local._4_4_ = local_94;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_serverTestConnection_create(apx_serverTestConnection_t *self)
{
   if (self != NULL)
   {
      apx_connectionBaseVTable_t base_connection_vtable;
      apx_connectionInterface_t connection_interface;
      self->default_buffer_size = 1024u;
      self->pending_bytes = 0u;
      apx_connectionBaseVTable_create(&base_connection_vtable,
         apx_serverTestConnection_vdestroy,
         apx_serverTestConnection_vstart,
         apx_serverTestConnection_vclose);
      create_connection_interface_vtable(self, &connection_interface);
      apx_error_t result = apx_serverConnection_create(&self->base, &base_connection_vtable, &connection_interface);
      if (result == APX_NO_ERROR)
      {
         self->transmit_log = adt_ary_new(adt_bytearray_vdelete);
         if (self->transmit_log == NULL)
         {
            result = APX_MEM_ERROR;
         }
         else
         {
            adt_bytearray_create(&self->transmit_buffer, 0u);
         }
      }
      if (result == APX_NO_ERROR)
      {
         apx_nodeManager_create(&self->node_manager, APX_SERVER_MODE);
         apx_serverConnection_attach_node_manager(&self->base, &self->node_manager);
      }
      return result;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}